

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O0

int WebPDequantizeLevels(uint8_t *data,int width,int height,int stride,int strength)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  SmoothParams p;
  int radius;
  undefined1 auStack_98 [4];
  int local_94;
  int local_8c;
  int local_78;
  SmoothParams *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  uint16_t *in_stack_ffffffffffffffa8;
  int local_40;
  int local_24;
  int local_4;
  
  local_24 = (in_R8D << 2) / 100;
  if ((in_R8D < 0) || (100 < in_R8D)) {
    local_4 = 0;
  }
  else if (((in_RDI == 0) || (in_ESI < 1)) || (in_EDX < 1)) {
    local_4 = 0;
  }
  else {
    if (in_ESI < local_24 * 2 + 1) {
      local_24 = in_ESI + -1 >> 1;
    }
    if (in_EDX < local_24 * 2 + 1) {
      local_24 = in_EDX + -1 >> 1;
    }
    if (0 < local_24) {
      memset(auStack_98,0,0x70);
      iVar1 = InitParams((uint8_t *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                         in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      if (iVar1 == 0) {
        return 0;
      }
      if (2 < local_40) {
        for (; local_8c < local_94; local_8c = local_8c + 1) {
          VFilter((SmoothParams *)auStack_98);
          if (local_78 <= local_8c) {
            HFilter((SmoothParams *)auStack_98);
            ApplyFilter(in_stack_ffffffffffffff90);
          }
        }
      }
      CleanupParams((SmoothParams *)0x182b4b);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int WebPDequantizeLevels(uint8_t* const data, int width, int height, int stride,
                         int strength) {
  int radius = 4 * strength / 100;

  if (strength < 0 || strength > 100) return 0;
  if (data == NULL || width <= 0 || height <= 0) return 0;  // bad params

  // limit the filter size to not exceed the image dimensions
  if (2 * radius + 1 > width) radius = (width - 1) >> 1;
  if (2 * radius + 1 > height) radius = (height - 1) >> 1;

  if (radius > 0) {
    SmoothParams p;
    memset(&p, 0, sizeof(p));
    if (!InitParams(data, width, height, stride, radius, &p)) return 0;
    if (p.num_levels_ > 2) {
      for (; p.row_ < p.height_; ++p.row_) {
        VFilter(&p);  // accumulate average of input
        // Need to wait few rows in order to prime the filter,
        // before emitting some output.
        if (p.row_ >= p.radius_) {
          HFilter(&p);
          ApplyFilter(&p);
        }
      }
    }
    CleanupParams(&p);
  }
  return 1;
}